

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

BaseExc * __thiscall Iex_2_5::BaseExc::assign(BaseExc *this,stringstream *s)

{
  BaseExc *in_RDI;
  string local_30 [48];
  
  std::__cxx11::stringstream::str();
  std::__cxx11::string::assign((string *)&in_RDI->_message);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

BaseExc &
BaseExc::assign (std::stringstream &s)
{
    _message.assign (s.str());
    return *this;
}